

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 c_v128_ssub_u16(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  c_v128 cVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[1];
  auVar1 = vpmovzxwd_avx(auVar1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = b.u64[1];
  auVar2 = vpmovzxwd_avx(auVar3);
  auVar1 = vpsubd_avx(auVar1,auVar2);
  auVar1 = vpmaxsd_avx(auVar1,(undefined1  [16])0x0);
  auVar3 = vpshufb_avx(auVar1,_DAT_00bef4e0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[0];
  auVar1 = vpmovzxwd_avx(auVar2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b.u64[0];
  auVar2 = vpmovzxwd_avx(auVar4);
  auVar1 = vpsubd_avx(auVar1,auVar2);
  auVar1 = vpmaxsd_avx(auVar1,(undefined1  [16])0x0);
  auVar1 = vpshufb_avx(auVar1,_DAT_00bef4e0);
  cVar5.u64[1] = auVar3._0_8_;
  cVar5.u64[0] = auVar1._0_8_;
  return cVar5;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_u16(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 4; c++)
    t.u16[c] =
        (int32_t)a.u16[c] - (int32_t)b.u16[c] < 0 ? 0 : a.u16[c] - b.u16[c];
  return t;
}